

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O2

void __thiscall
google::protobuf::UninterpretedOption_NamePart::~UninterpretedOption_NamePart
          (UninterpretedOption_NamePart *this)

{
  ~UninterpretedOption_NamePart(this);
  operator_delete(this);
  return;
}

Assistant:

UninterpretedOption_NamePart::~UninterpretedOption_NamePart() {
  // @@protoc_insertion_point(destructor:google.protobuf.UninterpretedOption.NamePart)
  SharedDtor();
}